

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void timeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  char local_68;
  char local_67;
  undefined1 local_66;
  char local_65;
  char local_64;
  undefined1 local_63;
  char local_62;
  char local_61;
  char zBuf [16];
  undefined1 local_50 [4];
  int s;
  DateTime x;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  x._40_8_ = argv;
  iVar1 = isDate(context,argc,argv,(DateTime *)local_50);
  if (iVar1 == 0) {
    computeHMS((DateTime *)local_50);
    local_68 = (char)((long)((ulong)(uint)((int)((long)x.M / 10) >> 0x1f) << 0x20 |
                            (long)x.M / 10 & 0xffffffffU) % 10) + '0';
    local_67 = (char)(x.M % 10) + '0';
    local_66 = 0x3a;
    local_65 = (char)((long)((ulong)(uint)((int)((long)x.D / 10) >> 0x1f) << 0x20 |
                            (long)x.D / 10 & 0xffffffffU) % 10) + '0';
    local_64 = (char)(x.D % 10) + '0';
    local_63 = 0x3a;
    zBuf._12_4_ = (undefined4)(double)x._24_8_;
    local_62 = (char)((long)((ulong)(uint)((int)((long)(int)zBuf._12_4_ / 10) >> 0x1f) << 0x20 |
                            (long)(int)zBuf._12_4_ / 10 & 0xffffffffU) % 10) + '0';
    local_61 = (char)((int)zBuf._12_4_ % 10) + '0';
    zBuf[0] = '\0';
    sqlite3_result_text(context,&local_68,8,(_func_void_void_ptr *)0xffffffffffffffff);
  }
  return;
}

Assistant:

static void timeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  if( isDate(context, argc, argv, &x)==0 ){
    int s;
    char zBuf[16];
    computeHMS(&x);
    zBuf[0] = '0' + (x.h/10)%10;
    zBuf[1] = '0' + (x.h)%10;
    zBuf[2] = ':';
    zBuf[3] = '0' + (x.m/10)%10;
    zBuf[4] = '0' + (x.m)%10;
    zBuf[5] = ':';
    s = (int)x.s;
    zBuf[6] = '0' + (s/10)%10;
    zBuf[7] = '0' + (s)%10;
    zBuf[8] = 0;
    sqlite3_result_text(context, zBuf, 8, SQLITE_TRANSIENT);
  }
}